

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  Node *pNVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  Node *local_40;
  
  pNVar5 = this->head_;
  iVar4 = (this->max_height_).super___atomic_base<int>._M_i + -1;
  do {
    pNVar1 = pNVar5->next_[iVar4]._M_b._M_p;
    if (pNVar1 == (Node *)0x0) {
LAB_00112709:
      if (prev != (Node **)0x0) {
        prev[iVar4] = pNVar5;
      }
      if (iVar4 == 0) {
        iVar4 = 0;
        bVar2 = false;
        local_40 = pNVar1;
      }
      else {
        iVar4 = iVar4 + -1;
        bVar2 = true;
      }
    }
    else {
      iVar3 = MemTable::KeyComparator::operator()(&this->compare_,pNVar1->key,*key);
      if (-1 < iVar3) goto LAB_00112709;
      bVar2 = true;
      pNVar5 = pNVar1;
    }
    if (!bVar2) {
      return local_40;
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}